

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

Btree tree_5_3::search_(Btree t,int e)

{
  int iVar1;
  
  if (t != (Btree)0x0) {
    do {
      iVar1 = t->data;
      if (iVar1 == e) {
        return t;
      }
      if (iVar1 <= e) {
        if (e <= iVar1) {
          return (Btree)0x0;
        }
        t = (Btree)&t->right;
      }
      t = t->left;
    } while (t != (node *)0x0);
  }
  return (Btree)0x0;
}

Assistant:

Btree search_(Btree t, int e) {
        if (t != nullptr) {
            if (t->data == e)
                return t;
            if (t->data > e)
                return search_(t->left, e);
            if (t->data < e)
                return search_(t->right, e);
        }
        return nullptr;
    }